

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O2

vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> * __thiscall
QPDFOutlineDocumentHelper::getOutlinesForPage
          (vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
           *__return_storage_ptr__,QPDFOutlineDocumentHelper *this,QPDFObjGen og)

{
  size_type sVar1;
  mapped_type *__x;
  element_type *peVar2;
  QPDFObjGen local_18;
  
  peVar2 = (this->m).
           super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_18 = og;
  if ((peVar2->by_page)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    initializeByPage(this);
    peVar2 = (this->m).
             super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  (__return_storage_ptr__->
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = std::
          map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::count(&peVar2->by_page,&local_18);
  if (sVar1 != 0) {
    __x = std::
          map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
          ::operator[](&((this->m).
                         super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->by_page,&local_18);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::operator=
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFOutlineObjectHelper>
QPDFOutlineDocumentHelper::getOutlinesForPage(QPDFObjGen og)
{
    if (m->by_page.empty()) {
        initializeByPage();
    }
    std::vector<QPDFOutlineObjectHelper> result;
    if (m->by_page.count(og)) {
        result = m->by_page[og];
    }
    return result;
}